

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

IndirOpnd * __thiscall
Lowerer::GenerateFastElemIStringIndexCommon
          (Lowerer *this,Instr *elemInstr,bool isStore,IndirOpnd *indirOpnd,LabelInstr *labelHelper,
          FldInfoFlags flags)

{
  RegOpnd *baseOpnd;
  RegOpnd *srcReg;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IndirOpnd *pIVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000089;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  undefined4 local_34;
  
  baseOpnd = indirOpnd->m_baseOpnd;
  srcReg = indirOpnd->m_indexOpnd;
  if (baseOpnd == (RegOpnd *)0x0) {
    local_34 = (undefined4)CONCAT71(in_register_00000011,isStore);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4088,"(baseOpnd != nullptr)","baseOpnd != nullptr");
    if (!bVar2) goto LAB_005e64ec;
    *puVar3 = 0;
    isStore = SUB41(local_34,0);
  }
  local_34 = (undefined4)CONCAT71(in_register_00000089,flags);
  local_36 = (srcReg->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsLikelyString((ValueType *)&local_36.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4089,"(indexOpnd->GetValueType().IsLikelyString())",
                       "indexOpnd->GetValueType().IsLikelyString()");
    if (!bVar2) {
LAB_005e64ec:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  GeneratePropertyStringTest(this,srcReg,elemInstr,labelHelper,isStore);
  pIVar4 = GenerateFastElemISymbolOrStringIndexCommon
                     (this,elemInstr,srcReg,baseOpnd,(uint)isStore * 8 + 0x28,0x38,labelHelper,
                      (FldInfoFlags)local_34);
  return pIVar4;
}

Assistant:

IR::IndirOpnd*
Lowerer::GenerateFastElemIStringIndexCommon(
    _In_ IR::Instr* elemInstr,
    _In_ bool isStore,
    _In_ IR::IndirOpnd* indirOpnd,
    _In_ IR::LabelInstr* labelHelper,
    _In_ Js::FldInfoFlags flags)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    Assert(baseOpnd != nullptr);
    Assert(indexOpnd->GetValueType().IsLikelyString());

    // Generates:
    //      PropertyStringTest(indexOpnd, $helper)                ; verify index is string type
    //      FastElemISymbolOrStringIndexCommon(indexOpnd, baseOpnd, $helper) ; shared code with JavascriptSymbol

    GeneratePropertyStringTest(indexOpnd, elemInstr, labelHelper, isStore);

    const uint32 inlineCacheOffset = isStore ? Js::PropertyString::GetOffsetOfStElemInlineCache() : Js::PropertyString::GetOffsetOfLdElemInlineCache();
    const uint32 hitRateOffset = Js::PropertyString::GetOffsetOfHitRate();

    return GenerateFastElemISymbolOrStringIndexCommon(elemInstr, indexOpnd, baseOpnd, inlineCacheOffset, hitRateOffset, labelHelper, flags);
}